

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawSplineSegmentBezierQuadratic(Vector2 p1,Vector2 c2,Vector2 p3,float thick,Color color)

{
  long lVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_1c8;
  float fStack_1c4;
  float local_1b8;
  float fStack_1b4;
  float local_1a8;
  float fStack_1a4;
  Vector2 local_198;
  float afStack_190 [98];
  
  memset(afStack_190 + 2,0,0x180);
  local_1c8 = p1.x;
  fStack_1c4 = p1.y;
  local_198.x = 0.0;
  local_198.y = 0.0;
  afStack_190[0] = 0.0;
  afStack_190[1] = 0.0;
  iVar2 = 1;
  fVar5 = local_1c8;
  fVar6 = fStack_1c4;
  for (lVar1 = 0x10; lVar1 != 400; lVar1 = lVar1 + 0x10) {
    fVar3 = (float)iVar2 * 0.041666668;
    fVar7 = 1.0 - fVar3;
    fVar8 = (fVar7 + fVar7) * fVar3;
    local_1b8 = c2.x;
    fStack_1b4 = c2.y;
    local_1a8 = p3.x;
    fStack_1a4 = p3.y;
    fVar4 = fVar3 * fVar3 * local_1a8 + fVar7 * fVar7 * local_1c8 + fVar8 * local_1b8;
    fVar3 = fVar3 * fVar3 * fStack_1a4 + fVar7 * fVar7 * fStack_1c4 + fVar8 * fStack_1b4;
    fVar7 = fVar3 - fVar6;
    fVar9 = fVar4 - fVar5;
    fVar8 = (thick * 0.5) / SQRT(fVar9 * fVar9 + fVar7 * fVar7);
    if (lVar1 == 0x10) {
      local_198.x = fVar7 * fVar8 + fVar5;
      local_198.y = -fVar9 * fVar8 + fVar6;
      afStack_190[0] = -fVar7 * fVar8 + fVar5;
      afStack_190[1] = fVar8 * fVar9 + fVar6;
    }
    *(float *)((long)&local_198.x + lVar1) = fVar8 * fVar7 + fVar4;
    *(float *)((long)afStack_190 + lVar1 + -4) = fVar8 * -fVar9 + fVar3;
    *(float *)((long)afStack_190 + lVar1) = fVar8 * -fVar7 + fVar4;
    *(float *)((long)afStack_190 + lVar1 + 4) = fVar8 * fVar9 + fVar3;
    iVar2 = iVar2 + 1;
    fVar5 = fVar4;
    fVar6 = fVar3;
  }
  DrawTriangleStrip(&local_198,0x32,color);
  return;
}

Assistant:

void DrawSplineSegmentBezierQuadratic(Vector2 p1, Vector2 c2, Vector2 p3, float thick, Color color)
{
    const float step = 1.0f/SPLINE_SEGMENT_DIVISIONS;

    Vector2 previous = p1;
    Vector2 current = { 0 };
    float t = 0.0f;

    Vector2 points[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 1; i <= SPLINE_SEGMENT_DIVISIONS; i++)
    {
        t = step*(float)i;

        float a = powf(1.0f - t, 2);
        float b = 2.0f*(1.0f - t)*t;
        float c = powf(t, 2);

        // NOTE: The easing functions aren't suitable here because they don't take a control point
        current.y = a*p1.y + b*c2.y + c*p3.y;
        current.x = a*p1.x + b*c2.x + c*p3.x;

        float dy = current.y - previous.y;
        float dx = current.x - previous.x;
        float size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

        if (i == 1)
        {
            points[0].x = previous.x + dy*size;
            points[0].y = previous.y - dx*size;
            points[1].x = previous.x - dy*size;
            points[1].y = previous.y + dx*size;
        }

        points[2*i + 1].x = current.x - dy*size;
        points[2*i + 1].y = current.y + dx*size;
        points[2*i].x = current.x + dy*size;
        points[2*i].y = current.y - dx*size;

        previous = current;
    }

    DrawTriangleStrip(points, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
}